

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argvParser.cpp
# Opt level: O0

bool __thiscall argvParser::foundAllRequierdArgs(argvParser *this)

{
  size_type sVar1;
  reference ppsVar2;
  reference ppaVar3;
  int local_20;
  int local_1c;
  int y;
  int x;
  argvParser *this_local;
  
  local_1c = 0;
  do {
    sVar1 = std::
            vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
            ::size((this->super_argParserAdvancedConfiguration).newargconfig);
    if (sVar1 <= (ulong)(long)local_1c) {
      return true;
    }
    local_20 = 0;
    while( true ) {
      ppsVar2 = std::
                vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                ::at((this->super_argParserAdvancedConfiguration).newargconfig,(long)local_1c);
      sVar1 = std::
              vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
              ::size((*ppsVar2)->arguments);
      if (sVar1 <= (ulong)(long)local_20) break;
      ppsVar2 = std::
                vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                ::at((this->super_argParserAdvancedConfiguration).newargconfig,(long)local_1c);
      ppaVar3 = std::
                vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                ::at((*ppsVar2)->arguments,(long)local_20);
      if (((*ppaVar3)->requiredAndNotHitJet & 1U) != 0) {
        return false;
      }
      local_20 = local_20 + 1;
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

bool argvParser::foundAllRequierdArgs() {
    for (int x = 0; x < newargconfig->size(); x++) {
        for(int y = 0; y<newargconfig->at(x)->arguments->size();y++){
            if (newargconfig->at(x)->arguments->at(y)->requiredAndNotHitJet)
                return false;
        }

    }
    return true;
}